

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O1

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::rehashPowerOfTwo(Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::NamedDecorator,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *this,size_t numBuckets)

{
  undefined8 *puVar1;
  Node *__ptr;
  uint8_t *puVar2;
  long *plVar3;
  undefined1 auVar4 [16];
  long *plVar5;
  ulong uVar6;
  ulong uVar7;
  size_t i;
  long lVar8;
  ulong uVar9;
  
  uVar6 = this->mMask + 1;
  if (uVar6 < 0x28f5c28f5c28f5d) {
    uVar7 = (uVar6 * 0x50) / 100;
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar6 >> 2;
    uVar7 = (SUB168(auVar4 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0x3ffffffffffffffc) * 0x14;
  }
  __ptr = this->mKeyVals;
  puVar2 = this->mInfo;
  uVar9 = 0xff;
  if (uVar7 < 0xff) {
    uVar9 = uVar7;
  }
  init_data(this,numBuckets);
  if (1 < uVar9 + uVar6) {
    lVar8 = 0;
    uVar7 = 0;
    do {
      if (puVar2[uVar7] != '\0') {
        insert_move(this,(Node *)((long)&(__ptr->mData).first._M_dataplus._M_p + lVar8));
        Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
        ::destroy((Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
                   *)((long)&(__ptr->mData).second.properties.properties.mKeyVals + lVar8));
        plVar3 = *(long **)((long)&(__ptr->mData).second.type._M_dataplus._M_p + lVar8);
        plVar5 = (long *)((__ptr->mData).second.type.field_2._M_local_buf + lVar8);
        if (plVar5 != plVar3) {
          operator_delete(plVar3,*plVar5 + 1);
        }
        puVar1 = (undefined8 *)((long)&(__ptr->mData).first._M_dataplus._M_p + lVar8);
        plVar5 = puVar1 + 2;
        plVar3 = (long *)*puVar1;
        if (plVar5 != plVar3) {
          operator_delete(plVar3,*plVar5 + 1);
        }
      }
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + 0x78;
    } while (uVar9 + uVar6 != uVar7);
    if (__ptr != (Node *)&this->mMask) {
      free(__ptr);
      return;
    }
  }
  return;
}

Assistant:

void rehashPowerOfTwo(size_t numBuckets) {
        ROBIN_HOOD_TRACE(this)

        Node* const oldKeyVals = mKeyVals;
        uint8_t const* const oldInfo = mInfo;

        const size_t oldMaxElementsWithBuffer = calcNumElementsWithBuffer(mMask + 1);

        // resize operation: move stuff
        init_data(numBuckets);
        if (oldMaxElementsWithBuffer > 1) {
            for (size_t i = 0; i < oldMaxElementsWithBuffer; ++i) {
                if (oldInfo[i] != 0) {
                    insert_move(std::move(oldKeyVals[i]));
                    // destroy the node but DON'T destroy the data.
                    oldKeyVals[i].~Node();
                }
            }

            // this check is not necessary as it's guarded by the previous if, but it helps silence
            // g++'s overeager "attempt to free a non-heap object 'map'
            // [-Werror=free-nonheap-object]" warning.
            if (oldKeyVals != reinterpret_cast_no_cast_align_warning<Node*>(&mMask)) {
                // don't destroy old data: put it into the pool instead
                DataPool::addOrFree(oldKeyVals, calcNumBytesTotal(oldMaxElementsWithBuffer));
            }
        }
    }